

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O2

bool __thiscall
jaegertracing::anon_unknown_11::SamplingPriorityVisitor::operator()
          (SamplingPriorityVisitor *this,string *str)

{
  byte bVar1;
  bool bVar2;
  long *plVar3;
  int intValue;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)this,_S_in);
  intValue = 0;
  plVar3 = (long *)std::istream::operator>>((istream *)&iss,&intValue);
  bVar1 = *(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20);
  bVar2 = 0 < intValue;
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return bVar2 && (bVar1 & 5) == 0;
}

Assistant:

bool operator()(const std::string& str) const
    {
        std::istringstream iss(str);
        auto intValue = 0;
        if (!(iss >> intValue)) {
            return false;
        }
        return intValue > 0;
    }